

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spikeestimator.cxx
# Opt level: O0

Matrix * __thiscall
SpikeEstimator::getEstimate(Matrix *__return_storage_ptr__,SpikeEstimator *this,Property *what)

{
  double d;
  allocator<char> local_221;
  string local_220;
  undefined1 local_1f9;
  Matrix local_1f8;
  string local_f8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  Property *local_20;
  Property *what_local;
  SpikeEstimator *this_local;
  Matrix *a;
  
  local_20 = what;
  what_local = (Property *)this;
  this_local = (SpikeEstimator *)__return_storage_ptr__;
  if (*what == 1) {
    getSample(__return_storage_ptr__,this);
  }
  else if (*what == 4) {
    local_21 = 0;
    Matrix::Matrix(__return_storage_ptr__,1);
    Parametric::getName_abi_cxx11_(&local_c8,(Parametric *)this->spkA);
    std::operator+(&local_a8,"1/T * integral( O-SPIKE ",&local_c8);
    std::operator+(&local_88,&local_a8," - ");
    Parametric::getName_abi_cxx11_(&local_f8,(Parametric *)this->spkB);
    std::operator+(&local_68,&local_88,&local_f8);
    std::operator+(&local_48,&local_68,") dt");
    Matrix::setName(__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    d = getMean(this);
    Matrix::operator[](&local_1f8,__return_storage_ptr__,0);
    Matrix::operator=(&local_1f8,d);
    Matrix::~Matrix(&local_1f8);
  }
  else {
    local_1f9 = 0;
    Matrix::Matrix(__return_storage_ptr__,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"Property not implemented",&local_221);
    Matrix::setName(__return_storage_ptr__,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix SpikeEstimator::getEstimate(const Property& what)
{
    if (what==EST_SAMPLE)
        return getSample();
    else if (what==EST_MEAN) {
        Matrix a{1};
        a.setName("1/T * integral( O-SPIKE " + spkA->getName() + " - " + spkB->getName() + ") dt");
        a[0] = getMean();
        return a;
    }
    else {
        Matrix a{0};
        a.setName("Property not implemented");
        return a;
    }
}